

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

longdouble * __thiscall
TPZMatrix<long_double>::GetRandomVal
          (longdouble *__return_storage_ptr__,TPZMatrix<long_double> *this)

{
  longdouble *in_RAX;
  
  if (GetRandomVal()::unif == '\0') {
    GetRandomVal();
  }
  if (GetRandomVal()::re == '\0') {
    GetRandomVal();
  }
  std::
  generate_canonical<long_double,64ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
            ((longdouble *)&GetRandomVal::re,
             (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)this);
  return in_RAX;
}

Assistant:

TVar TPZMatrix<TVar>::GetRandomVal() const{

    if constexpr (std::is_integral_v<TVar> ||
                  std::is_same_v<TVar,TPZFlopCounter>){
        return  ((TVar) rand())/((TVar)RAND_MAX);
    }
    
    else if constexpr (is_fad<TVar>::value){
      constexpr typename TVar::value_type lower_bound = 0;
      constexpr typename TVar::value_type upper_bound = 1;
      static std::uniform_real_distribution<typename TVar::value_type>
        unif(lower_bound,upper_bound);
      static std::default_random_engine re;
      TVar a_random = (TVar)unif(re);
      if constexpr (is_complex<TVar>::value){
        a_random+= (TVar)1i * (TVar)unif(re);
      }
      return a_random;
    }else{
        constexpr RTVar lower_bound = 0;
        constexpr RTVar upper_bound = 1;
        static std::uniform_real_distribution<RTVar> unif(lower_bound,upper_bound);
        static std::default_random_engine re;
        TVar a_random = (TVar)unif(re);
        if constexpr (is_complex<TVar>::value){
            a_random+= (TVar)1i * (TVar)unif(re);
        }
        return a_random;
    }
}